

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall CLIntercept::dumpKernelISABinaries(CLIntercept *this,cl_program program)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  cl_int cVar5;
  cl_uint cVar6;
  cl_kernel *__s;
  mapped_type *pmVar7;
  long lVar8;
  long *plVar9;
  undefined8 uVar10;
  long *plVar11;
  char *pcVar12;
  cl_kernel kernel;
  ulong uVar13;
  pthread_mutex_t *__mutex;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar15;
  cl_uint numKernels;
  cl_uint numDevices;
  cl_device_type deviceType;
  string fileNamePrefix;
  size_t kernelISABinarySize;
  char numberString [256];
  cl_uint local_200;
  cl_uint local_1fc;
  pthread_mutex_t *local_1f8;
  ulong local_1f0;
  cl_device_id *local_1e8;
  cl_program local_1e0;
  string local_1d8;
  char *local_1b8;
  cl_kernel local_1b0;
  char *local_1a8;
  cl_kernel *local_1a0;
  cl_device_id *local_198;
  size_t local_190;
  char *local_188;
  long *local_180;
  long local_178;
  long local_170;
  undefined4 uStack_168;
  undefined4 uStack_164;
  ulong local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138 [8];
  
  __mutex = (pthread_mutex_t *)&this->m_Mutex;
  local_1e0 = program;
  iVar4 = pthread_mutex_lock(__mutex);
  if (iVar4 != 0) {
    uVar10 = std::__throw_system_error(iVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
      operator_delete(local_138[0]._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    pthread_mutex_unlock(__mutex);
    _Unwind_Resume(uVar10);
  }
  local_200 = 0;
  cVar5 = (*(this->m_Dispatch).clCreateKernelsInProgram)(program,0,(cl_kernel *)0x0,&local_200);
  cVar6 = local_200;
  if (local_200 == 0 || cVar5 != 0) {
    local_1fc = 0;
    local_1e8 = (cl_device_id *)0x0;
    if (cVar5 != 0) goto LAB_00185440;
    __s = (cl_kernel *)0x0;
LAB_00184eff:
    local_1e8 = (cl_device_id *)0x0;
    local_1fc = 0;
    cVar5 = allocateAndGetProgramDeviceList(this,local_1e0,&local_1fc,&local_1e8);
    if (((__s != (cl_kernel *)0x0) && (cVar5 == 0)) && (local_1e0 != (cl_program)0x0)) {
      pmVar7 = std::
               map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
               ::operator[](&this->m_ProgramInfoMap,&local_1e0);
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      local_1d8._M_string_length = 0;
      local_1d8.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string((string *)local_138,sc_DumpDirectoryName,(allocator *)&local_180)
      ;
      OS::Services_Common::GetDumpDirectoryName
                (&(this->m_OS).super_Services_Common,local_138,&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
        operator_delete(local_138[0]._M_dataplus._M_p);
      }
      memset(local_138,0,0x100);
      if ((this->m_Config).OmitProgramNumber == true) {
        uVar1 = pmVar7->CompileCount;
        uVar2 = (uint)pmVar7->ProgramHash;
        uVar3 = (uint)pmVar7->OptionsHash;
        pcVar12 = "%08X_%04u_%08X_";
      }
      else {
        uVar1 = (uint)pmVar7->ProgramHash;
        uVar2 = pmVar7->ProgramNumber;
        uVar3 = pmVar7->CompileCount;
        pcVar12 = "%04u_%08X_%04u_%08X_";
      }
      snprintf((char *)local_138,0x100,pcVar12,(ulong)uVar2,(ulong)uVar1,(ulong)uVar3);
      local_1a0 = __s;
      std::__cxx11::string::append((char *)&local_1d8);
      std::__cxx11::string::append((char *)&local_1d8);
      local_1f8 = __mutex;
      lVar8 = std::__cxx11::string::find((char *)&local_1d8,0x19d01b,0);
      lVar8 = std::__cxx11::string::find((char *)&local_1d8,0x19d01b,lVar8 + 1);
      if (lVar8 != -1) {
        do {
          std::__cxx11::string::substr((ulong)local_138,(ulong)&local_1d8);
          mkdir(local_138[0]._M_dataplus._M_p,0x1ff);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
            operator_delete(local_138[0]._M_dataplus._M_p);
          }
          lVar8 = std::__cxx11::string::find((char *)&local_1d8,0x19d01b,lVar8 + 1);
        } while (lVar8 != -1);
      }
      if (local_200 != 0) {
        local_198 = local_1e8;
        uVar13 = 0;
        cVar5 = 0;
        do {
          local_1b0 = local_1a0[uVar13];
          local_188 = (char *)0x0;
          if (cVar5 == 0) {
            cVar5 = allocateAndGetKernelInfoString(this,local_1b0,0x1190,&local_188);
          }
          local_1b8 = local_188;
          local_160 = uVar13;
          if (local_1fc != 0) {
            uVar13 = 0;
            kernel = local_1b0;
            do {
              local_190 = 0;
              local_1a8 = (char *)0x0;
              if (cVar5 == 0) {
                cVar5 = allocateAndGetKernelISABinary
                                  (this,kernel,local_198[uVar13],&local_190,&local_1a8);
                pcVar12 = local_1a8;
                if (cVar5 == 0) {
                  local_138[0]._M_dataplus._M_p = (pointer)&local_138[0].field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_138,local_1d8._M_dataplus._M_p,
                             local_1d8._M_dataplus._M_p + local_1d8._M_string_length);
                  local_1f0 = 1;
                  (*(this->m_Dispatch).clGetDeviceInfo)
                            (local_198[uVar13],0x1000,8,&local_1f0,(size_t *)0x0);
                  if ((local_1f0 & 2) != 0) {
                    std::__cxx11::string::append((char *)local_138);
                  }
                  if ((local_1f0 & 4) != 0) {
                    std::__cxx11::string::append((char *)local_138);
                  }
                  if ((local_1f0 & 8) != 0) {
                    std::__cxx11::string::append((char *)local_138);
                  }
                  if ((local_1f0 & 0x10) != 0) {
                    std::__cxx11::string::append((char *)local_138);
                  }
                  std::__cxx11::string::append((char *)local_138);
                  std::__cxx11::string::append((char *)local_138);
                  std::operator+(&local_158,"Dumping kernel ISA binary to file: ",local_138);
                  plVar9 = (long *)std::__cxx11::string::append((char *)&local_158);
                  plVar11 = plVar9 + 2;
                  if ((long *)*plVar9 == plVar11) {
                    uVar14 = (undefined4)*plVar11;
                    uVar15 = *(undefined4 *)((long)plVar9 + 0x14);
                    local_170 = *plVar11;
                    uStack_168 = (undefined4)plVar9[3];
                    uStack_164 = *(undefined4 *)((long)plVar9 + 0x1c);
                    local_180 = &local_170;
                  }
                  else {
                    local_170 = *plVar11;
                    uVar14 = extraout_XMM0_Da;
                    uVar15 = extraout_XMM0_Db;
                    local_180 = (long *)*plVar9;
                  }
                  local_178 = plVar9[1];
                  *plVar9 = (long)plVar11;
                  plVar9[1] = 0;
                  *(undefined1 *)(plVar9 + 2) = 0;
                  log(this,(double)CONCAT44(uVar15,uVar14));
                  if (local_180 != &local_170) {
                    operator_delete(local_180);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_158._M_dataplus._M_p != &local_158.field_2) {
                    operator_delete(local_158._M_dataplus._M_p);
                  }
                  pcVar12 = local_1a8;
                  dumpMemoryToFile(this,local_138,false,local_1a8,local_190);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
                    operator_delete(local_138[0]._M_dataplus._M_p);
                  }
                }
                kernel = local_1b0;
                if (pcVar12 != (char *)0x0) {
                  operator_delete__(pcVar12);
                  kernel = local_1b0;
                }
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 < local_1fc);
          }
          if (local_1b8 != (char *)0x0) {
            operator_delete__(local_1b8);
          }
          uVar13 = local_160 + 1;
        } while (uVar13 < local_200);
      }
      __s = local_1a0;
      __mutex = local_1f8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
        __s = local_1a0;
        __mutex = local_1f8;
      }
      goto LAB_001853fa;
    }
    if (__s != (cl_kernel *)0x0) goto LAB_001853fa;
  }
  else {
    uVar13 = (ulong)local_200;
    __s = (cl_kernel *)operator_new__(uVar13 * 8);
    memset(__s,0,uVar13 * 8);
    cVar5 = (*(this->m_Dispatch).clCreateKernelsInProgram)(local_1e0,cVar6,__s,(cl_uint *)0x0);
    local_1fc = 0;
    local_1e8 = (cl_device_id *)0x0;
    if (cVar5 == 0) goto LAB_00184eff;
LAB_001853fa:
    if (local_200 != 0) {
      uVar13 = 0;
      cVar6 = local_200;
      do {
        if (__s[uVar13] != (cl_kernel)0x0) {
          (*(this->m_Dispatch).clReleaseKernel)();
          __s[uVar13] = (cl_kernel)0x0;
          cVar6 = local_200;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < cVar6);
    }
    operator_delete__(__s);
  }
  if (local_1e8 != (cl_device_id *)0x0) {
    operator_delete__(local_1e8);
  }
LAB_00185440:
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void CLIntercept::dumpKernelISABinaries(
    const cl_program program )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_int  errorCode = CL_SUCCESS;

    // Since the kernel ISA binaries are retrieved via kernel queries, the first
    // thing we need to do is to create the kernels for this program.

    cl_uint numKernels = 0;
    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clCreateKernelsInProgram(
            program,
            0,
            NULL,
            &numKernels );
    }
    cl_kernel*  kernels = NULL;
    if( errorCode == CL_SUCCESS && numKernels != 0 )
    {
        kernels = new cl_kernel[ numKernels ];
        if( kernels )
        {
            for( cl_uint k = 0; k < numKernels; k++ )
            {
                kernels[k] = NULL;
            }
            errorCode = dispatch().clCreateKernelsInProgram(
                program,
                numKernels,
                kernels,
                NULL );
        }
        else
        {
            errorCode = CL_OUT_OF_HOST_MEMORY;
        }
    }

    // Also, get the list of devices for the program.
    cl_uint         numDevices = 0;
    cl_device_id*   deviceList = NULL;
    if( errorCode == CL_SUCCESS )
    {
        errorCode = allocateAndGetProgramDeviceList(
            program,
            numDevices,
            deviceList );
    }

    if( errorCode == CL_SUCCESS && program != NULL && kernels != NULL )
    {
        const SProgramInfo& programInfo = m_ProgramInfoMap[ program ];

        std::string fileNamePrefix;

        // Get the dump directory name.
        {
            OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileNamePrefix );
        }
        // Make the file name prefix.  It will have the form:
        //   CLI_<program number>_<program hash>_<compile count>_<options hash>_<device type>_<kernel name>.isabin
        // We'll fill in the device type and kernel name later.
        {
            char    numberString[256] = "";

            if( config().OmitProgramNumber )
            {
                CLI_SPRINTF( numberString, 256, "%08X_%04u_%08X_",
                    (unsigned int)programInfo.ProgramHash,
                    programInfo.CompileCount,
                    (unsigned int)programInfo.OptionsHash );
            }
            else
            {
                CLI_SPRINTF( numberString, 256, "%04u_%08X_%04u_%08X_",
                    programInfo.ProgramNumber,
                    (unsigned int)programInfo.ProgramHash,
                    programInfo.CompileCount,
                    (unsigned int)programInfo.OptionsHash );
            }

            fileNamePrefix += "/CLI_";
            fileNamePrefix += numberString;
        }
        // Now make directories as appropriate.
        {
            OS().MakeDumpDirectories( fileNamePrefix );
        }

        for( cl_uint k = 0; k < numKernels; k++ )
        {
            cl_kernel   kernel = kernels[ k ];

            // Get the kernel name.  We can't use the kernel name map yet, so
            // use a kernel query instead.
            char* kernelName = NULL;
            if( errorCode == CL_SUCCESS )
            {
                errorCode = allocateAndGetKernelInfoString(
                    kernel,
                    CL_KERNEL_FUNCTION_NAME,
                    kernelName );
            }

            for( cl_uint d = 0; d < numDevices; d++ )
            {
                size_t      kernelISABinarySize = 0;
                char*       kernelISABinary = NULL;

                if( errorCode == CL_SUCCESS )
                {
                    errorCode = allocateAndGetKernelISABinary(
                        kernel,
                        deviceList[d],
                        kernelISABinarySize,
                        kernelISABinary );
                }

                if( errorCode == CL_SUCCESS )
                {
                    std::string fileName( fileNamePrefix );

                    cl_device_type  deviceType = CL_DEVICE_TYPE_DEFAULT;

                    // It's OK if this fails.  If it does, it just
                    // means that our output file won't have a device
                    // type.
                    dispatch().clGetDeviceInfo(
                        deviceList[d],
                        CL_DEVICE_TYPE,
                        sizeof( deviceType ),
                        &deviceType,
                        NULL );

                    if( deviceType & CL_DEVICE_TYPE_CPU )
                    {
                        fileName += "CPU_";
                    }
                    if( deviceType & CL_DEVICE_TYPE_GPU )
                    {
                        fileName += "GPU_";
                    }
                    if( deviceType & CL_DEVICE_TYPE_ACCELERATOR )
                    {
                        fileName += "ACC_";
                    }
                    if( deviceType & CL_DEVICE_TYPE_CUSTOM )
                    {
                        fileName+= "CUSTOM_";
                    }

                    fileName += kernelName;
                    fileName += ".isabin";

                    log( "Dumping kernel ISA binary to file: " + fileName + "\n" );
                    dumpMemoryToFile(
                        fileName,
                        false,
                        kernelISABinary,
                        kernelISABinarySize );
                }

                delete [] kernelISABinary;
                kernelISABinary = NULL;
            }

            delete [] kernelName;
            kernelName = NULL;
        }
    }

    // If we have kernels, release them.
    if( kernels )
    {
        for( cl_uint k = 0; k < numKernels; k++ )
        {
            if( kernels[k] )
            {
                dispatch().clReleaseKernel( kernels[k] );
                kernels[k] = NULL;
            }
        }
    }

    delete [] kernels;
    kernels = NULL;

    delete [] deviceList;
    deviceList = NULL;
}